

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_transport_ll_private.c
# Opt level: O3

int IoTHub_Transport_ValidateCallbacks(TRANSPORT_CALLBACKS_INFO *transport_cb)

{
  LOGGER_LOG p_Var1;
  int iVar2;
  
  if ((((((transport_cb == (TRANSPORT_CALLBACKS_INFO *)0x0) ||
         (transport_cb->connection_status_cb == (pfTransport_ConnectionStatusCallBack)0x0)) ||
        (transport_cb->msg_input_cb == (pfTransport_MessageCallbackFromInput)0x0)) ||
       ((transport_cb->msg_cb == (pfTransport_MessageCallback)0x0 ||
        (transport_cb->send_complete_cb == (pfTransport_SendComplete_Callback)0x0)))) ||
      ((transport_cb->prod_info_cb == (pfTransport_GetOption_Product_Info_Callback)0x0 ||
       ((transport_cb->twin_rpt_state_complete_cb ==
         (pfTransport_Twin_ReportedStateComplete_Callback)0x0 ||
        (transport_cb->twin_retrieve_prop_complete_cb ==
         (pfTransport_Twin_RetrievePropertyComplete_Callback)0x0)))))) ||
     (iVar2 = 0, transport_cb->method_complete_cb == (pfTransport_DeviceMethod_Complete_Callback)0x0
     )) {
    p_Var1 = xlogging_get_log_function();
    iVar2 = 0x19;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_transport_ll_private.c"
                ,"IoTHub_Transport_ValidateCallbacks",0x18,1,"Failure callback function NULL");
    }
  }
  return iVar2;
}

Assistant:

int IoTHub_Transport_ValidateCallbacks(const TRANSPORT_CALLBACKS_INFO* transport_cb)
{
    int result;
    if (
        transport_cb == NULL ||
        transport_cb->connection_status_cb == NULL ||
        transport_cb->msg_input_cb == NULL ||
        transport_cb->msg_cb == NULL ||
        transport_cb->send_complete_cb == NULL ||
        transport_cb->prod_info_cb == NULL ||
        transport_cb->twin_rpt_state_complete_cb == NULL ||
        transport_cb->twin_retrieve_prop_complete_cb == NULL ||
        transport_cb->method_complete_cb == NULL
        )
    {
        LogError("Failure callback function NULL");
        result = MU_FAILURE;
    }
    else
    {
        result = 0;
    }
    return result;
}